

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::QuantileBindData::Deserialize(Deserializer *deserializer,AggregateFunction *function)

{
  _Head_base<0UL,_duckdb::QuantileBindData_*,_false> _Var1;
  pointer pVVar2;
  pointer pQVar3;
  pointer v;
  QuantileSerializationType deserialization_type;
  _Head_base<0UL,_duckdb::QuantileBindData_*,_false> local_c0;
  vector<duckdb::Value,_true> raw;
  QuantileValue local_98;
  
  make_uniq<duckdb::QuantileBindData>();
  raw.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  raw.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  raw.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Deserializer::ReadProperty<duckdb::vector<duckdb::Value,true>>
            ((Deserializer *)function,100,"quantiles",&raw);
  pQVar3 = unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>
           ::operator->((unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>
                         *)&local_c0);
  Deserializer::ReadProperty<duckdb::vector<unsigned_long,true>>
            ((Deserializer *)function,0x65,"order",&pQVar3->order);
  pQVar3 = unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>
           ::operator->((unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>
                         *)&local_c0);
  Deserializer::ReadProperty<bool>((Deserializer *)function,0x66,"desc",&pQVar3->desc);
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::QuantileSerializationType>
            ((Deserializer *)function,0x67,"quantile_type",&deserialization_type,NON_DECIMAL);
  if (deserialization_type != NON_DECIMAL) {
    Deserializer::ReadDeletedProperty<duckdb::LogicalType>
              ((Deserializer *)function,0x68,"logical_type");
  }
  pVVar2 = raw.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (v = raw.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start; _Var1._M_head_impl = local_c0._M_head_impl, v != pVVar2
      ; v = v + 1) {
    pQVar3 = unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>
             ::operator->((unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>
                           *)&local_c0);
    QuantileValue::QuantileValue(&local_98,v);
    ::std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::
    emplace_back<duckdb::QuantileValue>
              (&(pQVar3->quantiles).
                super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>,
               &local_98);
    Value::~Value(&local_98.val);
  }
  local_c0._M_head_impl = (QuantileBindData *)0x0;
  deserializer->_vptr_Deserializer = (_func_int **)_Var1._M_head_impl;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&raw);
  if (local_c0._M_head_impl != (QuantileBindData *)0x0) {
    (*((local_c0._M_head_impl)->super_FunctionData)._vptr_FunctionData[1])();
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

unique_ptr<FunctionData> QuantileBindData::Deserialize(Deserializer &deserializer, AggregateFunction &function) {
	auto result = make_uniq<QuantileBindData>();
	vector<Value> raw;
	deserializer.ReadProperty(100, "quantiles", raw);
	deserializer.ReadProperty(101, "order", result->order);
	deserializer.ReadProperty(102, "desc", result->desc);
	QuantileSerializationType deserialization_type;
	deserializer.ReadPropertyWithExplicitDefault(103, "quantile_type", deserialization_type,
	                                             QuantileSerializationType::NON_DECIMAL);

	if (deserialization_type != QuantileSerializationType::NON_DECIMAL) {
		deserializer.ReadDeletedProperty<LogicalType>(104, "logical_type");
	}

	for (const auto &r : raw) {
		result->quantiles.emplace_back(QuantileValue(r));
	}
	return std::move(result);
}